

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

bool duckdb::ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
               (string_t *value,long *begin,long *end)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = *begin;
  if ((uVar4 & 0x7fffffffffffffff) != 0) {
    uVar4 = uVar4 - 1;
  }
  *begin = uVar4;
  uVar2 = (ulong)(value->value).pointer.length;
  bVar1 = SBORROW8(uVar2,-uVar4) != (long)(uVar2 + uVar4) < 0;
  if (bVar1 && (long)uVar4 < 0) {
    lVar3 = *end;
    if (SBORROW8(lVar3,-uVar2) != (long)(lVar3 + uVar2) < 0 && lVar3 < 0) {
      *begin = 0;
      lVar3 = 0;
      goto LAB_01bdb357;
    }
    if (bVar1 && (long)uVar4 < 0) {
      *begin = 0;
    }
  }
  lVar3 = *begin;
  if (lVar3 < 0) {
    uVar4 = lVar3 + uVar2 + (ulong)(uVar4 != 0x8000000000000000);
LAB_01bdb32f:
    *begin = uVar4;
  }
  else {
    uVar4 = uVar2;
    if ((long)uVar2 < lVar3) goto LAB_01bdb32f;
  }
  lVar3 = *end;
  if (lVar3 < 0) {
    uVar2 = uVar2 + lVar3 + 1;
LAB_01bdb347:
    *end = uVar2;
  }
  else if ((long)uVar2 < lVar3) goto LAB_01bdb347;
  lVar3 = *end;
  if (*end < *begin) {
    lVar3 = *begin;
  }
LAB_01bdb357:
  *end = lVar3;
  return SUB81(lVar3,0);
}

Assistant:

static bool ClampSlice(const INPUT_TYPE &value, INDEX_TYPE &begin, INDEX_TYPE &end) {
	// Clamp offsets
	begin = (begin != 0 && begin != (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) ? begin - 1 : begin;

	bool is_min = false;
	if (begin == (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) {
		begin++;
		is_min = true;
	}

	const auto length = OP::ValueLength(value);
	if (begin < 0 && -begin > length && end < 0 && end < -length) {
		begin = 0;
		end = 0;
		return true;
	}
	if (begin < 0 && -begin > length) {
		begin = 0;
	}
	ClampIndex(begin, value, length, is_min);
	ClampIndex(end, value, length, false);
	end = MaxValue<INDEX_TYPE>(begin, end);

	return true;
}